

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O0

AnalyserVariablePtr __thiscall
libcellml::Generator::GeneratorImpl::analyserVariable(GeneratorImpl *this,VariablePtr *variable)

{
  bool bVar1;
  element_type *peVar2;
  __shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3
  ;
  reference psVar4;
  VariablePtr *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  AnalyserVariablePtr AVar6;
  VariablePtr local_d8;
  __normal_iterator<std::shared_ptr<libcellml::AnalyserVariable>_*,_std::vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>_>
  local_c8;
  iterator modelVariable;
  vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
  modelVariables;
  shared_ptr<libcellml::AnalyserVariable> *modelState;
  __normal_iterator<std::shared_ptr<libcellml::AnalyserVariable>_*,_std::vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>_>
  local_88;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
  *__range2;
  VariablePtr modelVoiVariable;
  undefined1 local_38 [8];
  AnalyserVariablePtr modelVoi;
  VariablePtr *variable_local;
  GeneratorImpl *this_local;
  AnalyserVariablePtr *res;
  
  modelVoi.super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 0;
  std::shared_ptr<libcellml::AnalyserVariable>::shared_ptr
            ((shared_ptr<libcellml::AnalyserVariable> *)this);
  std::__shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)variable);
  AnalyserModel::voi((AnalyserModel *)local_38);
  bVar1 = std::operator!=((shared_ptr<libcellml::AnalyserVariable> *)local_38,(nullptr_t)0x0);
  if (bVar1) {
    std::__shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_38);
    AnalyserVariable::variable((AnalyserVariable *)&__range2);
  }
  else {
    std::shared_ptr<libcellml::Variable>::shared_ptr
              ((shared_ptr<libcellml::Variable> *)&__range2,(nullptr_t)0x0);
  }
  bVar1 = std::operator!=((shared_ptr<libcellml::Variable> *)&__range2,(nullptr_t)0x0);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
    bVar1 = AnalyserModel::areEquivalentVariables(peVar2,in_RDX,(VariablePtr *)&__range2);
    if (bVar1) {
      std::shared_ptr<libcellml::AnalyserVariable>::operator=
                ((shared_ptr<libcellml::AnalyserVariable> *)this,
                 (shared_ptr<libcellml::AnalyserVariable> *)local_38);
      goto LAB_002b817a;
    }
  }
  peVar2 = std::
           __shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)variable);
  AnalyserModel::states
            ((vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
              *)&__begin2,peVar2);
  __end2 = std::
           vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
           ::begin((vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
                    *)&__begin2);
  local_88._M_current =
       (shared_ptr<libcellml::AnalyserVariable> *)
       std::
       vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
       ::end((vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
              *)&__begin2);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_88), bVar1) {
    p_Var3 = (__shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)__gnu_cxx::
                __normal_iterator<std::shared_ptr<libcellml::AnalyserVariable>_*,_std::vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>_>
                ::operator*(&__end2);
    peVar2 = std::
             __shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
    std::__shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->(p_Var3);
    AnalyserVariable::variable
              ((AnalyserVariable *)
               &modelVariables.
                super__Vector_base<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = AnalyserModel::areEquivalentVariables
                      (peVar2,in_RDX,
                       (VariablePtr *)
                       &modelVariables.
                        super__Vector_base<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::shared_ptr<libcellml::Variable>::~shared_ptr
              ((shared_ptr<libcellml::Variable> *)
               &modelVariables.
                super__Vector_base<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      std::shared_ptr<libcellml::AnalyserVariable>::operator=
                ((shared_ptr<libcellml::AnalyserVariable> *)this,
                 (shared_ptr<libcellml::AnalyserVariable> *)p_Var3);
      break;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libcellml::AnalyserVariable>_*,_std::vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
  ::~vector((vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
             *)&__begin2);
  bVar1 = std::operator==((shared_ptr<libcellml::AnalyserVariable> *)this,(nullptr_t)0x0);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)variable);
    AnalyserModel::variables
              ((vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
                *)&modelVariable,peVar2);
    local_c8._M_current =
         (shared_ptr<libcellml::AnalyserVariable> *)
         std::
         vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
         ::begin((vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
                  *)&modelVariable);
    do {
      peVar2 = std::
               __shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::AnalyserModel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)variable);
      p_Var3 = (__shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<libcellml::AnalyserVariable>_*,_std::vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>_>
                  ::operator*(&local_c8);
      std::
      __shared_ptr_access<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->(p_Var3);
      AnalyserVariable::variable((AnalyserVariable *)&local_d8);
      bVar1 = AnalyserModel::areEquivalentVariables(peVar2,in_RDX,&local_d8);
      std::shared_ptr<libcellml::Variable>::~shared_ptr(&local_d8);
      if (bVar1) {
        psVar4 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<libcellml::AnalyserVariable>_*,_std::vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>_>
                 ::operator*(&local_c8);
        std::shared_ptr<libcellml::AnalyserVariable>::operator=
                  ((shared_ptr<libcellml::AnalyserVariable> *)this,psVar4);
      }
      else {
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<libcellml::AnalyserVariable>_*,_std::vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>_>
        ::operator++(&local_c8);
      }
      bVar1 = std::operator==((shared_ptr<libcellml::AnalyserVariable> *)this,(nullptr_t)0x0);
    } while (bVar1);
    std::
    vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::AnalyserVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserVariable>_>_>
               *)&modelVariable);
  }
LAB_002b817a:
  modelVoi.super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._7_1_ = 1;
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)&__range2);
  std::shared_ptr<libcellml::AnalyserVariable>::~shared_ptr
            ((shared_ptr<libcellml::AnalyserVariable> *)local_38);
  _Var5._M_pi = extraout_RDX;
  if ((modelVoi.super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi._7_1_ & 1) == 0) {
    std::shared_ptr<libcellml::AnalyserVariable>::~shared_ptr
              ((shared_ptr<libcellml::AnalyserVariable> *)this);
    _Var5._M_pi = extraout_RDX_00;
  }
  AVar6.super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  AVar6.super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (AnalyserVariablePtr)
         AVar6.super___shared_ptr<libcellml::AnalyserVariable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

AnalyserVariablePtr Generator::GeneratorImpl::analyserVariable(const VariablePtr &variable) const
{
    // Find and return the analyser variable associated with the given variable.

    AnalyserVariablePtr res;
    auto modelVoi = mModel->voi();
    VariablePtr modelVoiVariable = (modelVoi != nullptr) ? modelVoi->variable() : nullptr;

    if ((modelVoiVariable != nullptr)
        && mModel->areEquivalentVariables(variable, modelVoiVariable)) {
        res = modelVoi;
    } else {
        for (const auto &modelState : mModel->states()) {
            if (mModel->areEquivalentVariables(variable, modelState->variable())) {
                res = modelState;

                break;
            }
        }

        if (res == nullptr) {
            // Normally, we would have:
            //
            //     for (const auto &modelVariable : mModel->variables()) {
            //         if (mModel->areEquivalentVariables(variable, modelVariable->variable())) {
            //             res = modelVariable;
            //
            //             break;
            //         }
            //     }
            //
            // but we always have variables, so llvm-cov will complain that the
            // false branch of our for loop is never reached. The below code is
            // a bit more verbose but at least it makes llvm-cov happy.

            auto modelVariables = mModel->variables();
            auto modelVariable = modelVariables.begin();

            do {
                if (mModel->areEquivalentVariables(variable, (*modelVariable)->variable())) {
                    res = *modelVariable;
                } else {
                    ++modelVariable;
                }
            } while (res == nullptr);
        }
    }

    return res;
}